

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.hpp
# Opt level: O1

shared_ptr<helics::CoreFactory::CoreBuilder>
helics::CoreFactory::
addCoreType<helics::NetworkCore<helics::ipc::IpcComms,(gmlc::networking::InterfaceTypes)3>>
          (string_view coreTypeName,int code)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar1;
  int in_R8D;
  shared_ptr<helics::CoreFactory::CoreBuilder> sVar2;
  string_view name;
  _func_int **local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  name._M_len._4_4_ = in_register_00000014;
  name._M_len._0_4_ = code;
  peVar1 = (element_type *)coreTypeName._M_len;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0055d370;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR_build_0055d3c0;
  peVar1->_vptr_CoreBuilder = (_func_int **)(this + 1);
  peVar1[1]._vptr_CoreBuilder = (_func_int **)this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  local_38 = peVar1->_vptr_CoreBuilder;
  local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1[1]._vptr_CoreBuilder;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  name._M_str._0_4_ = in_ECX;
  name._M_str._4_4_ = 0;
  defineCoreBuilder((CoreFactory *)&local_38,
                    (shared_ptr<helics::CoreFactory::CoreBuilder> *)coreTypeName._M_str,name,in_R8D)
  ;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  sVar2.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  return (shared_ptr<helics::CoreFactory::CoreBuilder>)
         sVar2.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CoreBuilder> addCoreType(std::string_view coreTypeName, int code)
    {
        auto bld = std::make_shared<CoreTypeBuilder<CoreTYPE>>();
        std::shared_ptr<CoreBuilder> cbld = std::static_pointer_cast<CoreBuilder>(bld);
        defineCoreBuilder(cbld, coreTypeName, code);
        return cbld;
    }